

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t rar5_read_header(archive_read *a,archive_entry *entry)

{
  wchar_t wVar1;
  rar5 *prVar2;
  bool local_2e;
  wchar_t ret;
  rar5 *rar;
  archive_entry *entry_local;
  archive_read *a_local;
  
  prVar2 = get_context(a);
  if (prVar2->header_initialized == L'\0') {
    init_header(a);
    wVar1 = try_skip_sfx(a);
    if (wVar1 < L'\xffffffec') {
      return wVar1;
    }
    prVar2->header_initialized = L'\x01';
  }
  if (prVar2->skipped_magic == L'\0') {
    wVar1 = consume(a,8);
    if (wVar1 != L'\0') {
      return L'\x01';
    }
    prVar2->skipped_magic = L'\x01';
  }
  do {
    wVar1 = process_base_block(a,entry);
    local_2e = true;
    if (wVar1 != L'\xfffffff6') {
      local_2e = (*(byte *)&prVar2->main >> 2 & 1) != 0 && wVar1 == L'\0';
    }
  } while (local_2e);
  return wVar1;
}

Assistant:

static int rar5_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct rar5* rar = get_context(a);
	int ret;

	if(rar->header_initialized == 0) {
		init_header(a);
		if ((ret = try_skip_sfx(a)) < ARCHIVE_WARN)
			return ret;
		rar->header_initialized = 1;
	}

	if(rar->skipped_magic == 0) {
		if(ARCHIVE_OK != consume(a, sizeof(rar5_signature_xor))) {
			return ARCHIVE_EOF;
		}

		rar->skipped_magic = 1;
	}

	do {
		ret = process_base_block(a, entry);
	} while(ret == ARCHIVE_RETRY ||
			(rar->main.endarc > 0 && ret == ARCHIVE_OK));

	return ret;
}